

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  if (0.0 < radius) {
    _PathArcToFastEx(this,center,radius,a_min_of_12 << 2,a_max_of_12 << 2,0);
    return;
  }
  ImVector<ImVec2>::push_back(&this->_Path,center);
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }
    _PathArcToFastEx(center, radius, a_min_of_12 * IM_DRAWLIST_ARCFAST_SAMPLE_MAX / 12, a_max_of_12 * IM_DRAWLIST_ARCFAST_SAMPLE_MAX / 12, 0);
}